

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

void unmul(char *msg_override)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  char *pcVar1;
  
  if (-1 < multi) {
    u._1052_1_ = u._1052_1_ & 0xef;
    u.usleep = 0;
    multi = 0;
    memset(multi_txt,0,0x100);
    flags.run = 0;
    flags.mv = '\0';
    iflags.travel1 = '\0';
    flags.travel = '\0';
  }
  pcVar1 = msg_override;
  if ((msg_override == (char *)0x0) && (pcVar1 = nomovemsg, nomovemsg == (char *)0x0)) {
    pcVar1 = "You can move again.";
  }
  nomovemsg = pcVar1;
  if (*nomovemsg != '\0') {
    pline(nomovemsg);
  }
  UNRECOVERED_JUMPTABLE = afternmv;
  nomovemsg = (char *)0x0;
  afternmv = (_func_int *)0x0;
  if (UNRECOVERED_JUMPTABLE == (_func_int *)0x0) {
    return;
  }
  (*UNRECOVERED_JUMPTABLE)();
  return;
}

Assistant:

void unmul(const char *msg_override)
{
	int (*saved_afternmv)(void);

	nomul(0, NULL);

	if (msg_override) nomovemsg = msg_override;
	else if (!nomovemsg) nomovemsg = "You can move again.";
	if (*nomovemsg) pline(nomovemsg);
	nomovemsg = 0;

	/*
	 * Unsetting afternmv is required for donning/donning_on/donning_off()
	 * to return accurate results, so equip_is_worn() returns accurate
	 * results, so adj_abon() will do its job when the Foo_on() functions
	 * call it at the end of armor-wearing delays.
	 *
	 * P.S. I checked: no other functions rely on afternmv being set.
	 */
	saved_afternmv = afternmv;
	afternmv = NULL;
	if (saved_afternmv) (*saved_afternmv)();
}